

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_types.h
# Opt level: O0

UnicodeString * __thiscall
icu_63::numparse::impl::CompactUnicodeString<4>::toAliasedUnicodeString
          (UnicodeString *__return_storage_ptr__,CompactUnicodeString<4> *this)

{
  char16_t *p;
  ConstChar16Ptr local_20;
  CompactUnicodeString<4> *local_18;
  CompactUnicodeString<4> *this_local;
  
  local_18 = this;
  this_local = (CompactUnicodeString<4> *)__return_storage_ptr__;
  p = MaybeStackArray<char16_t,_4>::getAlias(&this->fBuffer);
  ConstChar16Ptr::ConstChar16Ptr(&local_20,p);
  UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',&local_20,-1);
  ConstChar16Ptr::~ConstChar16Ptr(&local_20);
  return __return_storage_ptr__;
}

Assistant:

inline UnicodeString toAliasedUnicodeString() const {
        return UnicodeString(TRUE, fBuffer.getAlias(), -1);
    }